

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NtpClient.h
# Opt level: O0

void __thiscall NtpClient::readPendingDatagrams(NtpClient *this)

{
  NtpFullPacket packet_00;
  quint16 _t2;
  ulong uVar1;
  pointer pQVar2;
  QDateTime local_120 [8];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  NtpReply local_c8;
  undefined4 local_78;
  quint16 local_62;
  QHostAddress local_60 [6];
  quint16 port;
  QHostAddress address;
  NtpFullPacket packet;
  NtpClient *this_local;
  
  while( true ) {
    std::unique_ptr<QUdpSocket,_std::default_delete<QUdpSocket>_>::operator->(&this->m_socket);
    uVar1 = QUdpSocket::hasPendingDatagrams();
    if ((uVar1 & 1) == 0) break;
    _address = 0;
    QHostAddress::QHostAddress(local_60);
    pQVar2 = std::unique_ptr<QUdpSocket,_std::default_delete<QUdpSocket>_>::operator->
                       (&this->m_socket);
    uVar1 = QUdpSocket::readDatagram
                      ((char *)pQVar2,(longlong)&address,(QHostAddress *)0x44,(ushort *)local_60);
    _t2 = local_62;
    if (uVar1 < 0x30) {
      local_78 = 2;
    }
    else {
      local_d8 = 0;
      local_e8 = 0;
      uStack_e0 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      local_108 = 0;
      uStack_100 = 0;
      local_118 = _address;
      uStack_110 = 0;
      QDateTime::currentDateTime();
      packet_00.basic.rootDispersion = (undefined4)uStack_110;
      packet_00.basic.referenceID[0] = uStack_110._4_1_;
      packet_00.basic.referenceID[1] = uStack_110._5_1_;
      packet_00.basic.referenceID[2] = uStack_110._6_1_;
      packet_00.basic.referenceID[3] = uStack_110._7_1_;
      packet_00.basic.flags = (NtpPacketFlags)(undefined1)local_118;
      packet_00.basic.stratum = local_118._1_1_;
      packet_00.basic.poll = local_118._2_1_;
      packet_00.basic.precision = local_118._3_1_;
      packet_00.basic.rootDelay = local_118._4_4_;
      packet_00.basic.referenceTimestamp.seconds = (undefined4)local_108;
      packet_00.basic.referenceTimestamp.fraction = local_108._4_4_;
      packet_00.basic.originateTimestamp.seconds = (undefined4)uStack_100;
      packet_00.basic.originateTimestamp.fraction = uStack_100._4_4_;
      packet_00.basic.receiveTimestamp.seconds = (undefined4)local_f8;
      packet_00.basic.receiveTimestamp.fraction = local_f8._4_4_;
      packet_00.basic.transmitTimestamp.seconds = (undefined4)uStack_f0;
      packet_00.basic.transmitTimestamp.fraction = uStack_f0._4_4_;
      packet_00.auth.keyId = (undefined4)local_e8;
      packet_00.auth.messageDigest[0] = local_e8._4_1_;
      packet_00.auth.messageDigest[1] = local_e8._5_1_;
      packet_00.auth.messageDigest[2] = local_e8._6_1_;
      packet_00.auth.messageDigest[3] = local_e8._7_1_;
      packet_00.auth.messageDigest[4] = (undefined1)uStack_e0;
      packet_00.auth.messageDigest[5] = uStack_e0._1_1_;
      packet_00.auth.messageDigest[6] = uStack_e0._2_1_;
      packet_00.auth.messageDigest[7] = uStack_e0._3_1_;
      packet_00.auth.messageDigest[8] = uStack_e0._4_1_;
      packet_00.auth.messageDigest[9] = uStack_e0._5_1_;
      packet_00.auth.messageDigest[10] = uStack_e0._6_1_;
      packet_00.auth.messageDigest[0xb] = uStack_e0._7_1_;
      packet_00.auth.messageDigest[0xc] = (undefined1)local_d8;
      packet_00.auth.messageDigest[0xd] = local_d8._1_1_;
      packet_00.auth.messageDigest[0xe] = local_d8._2_1_;
      packet_00.auth.messageDigest[0xf] = local_d8._3_1_;
      NtpReply::NtpReply(&local_c8,packet_00,local_120);
      replyReceived(this,local_60,_t2,&local_c8);
      NtpReply::~NtpReply(&local_c8);
      QDateTime::~QDateTime(local_120);
      local_78 = 0;
    }
    QHostAddress::~QHostAddress(local_60);
  }
  return;
}

Assistant:

void readPendingDatagrams() {
        while (m_socket->hasPendingDatagrams()) {
            NtpFullPacket packet;
            memset(&packet, 0, sizeof(packet));

            QHostAddress address;
            quint16 port;
            if (m_socket->readDatagram(reinterpret_cast<char *>(&packet), sizeof(packet), &address, &port) < sizeof(NtpPacket))
                continue;

            Q_EMIT replyReceived(address, port, NtpReply(packet, QDateTime::currentDateTime()));
        }
    }